

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

CURLcode checkpasswd(char *kind,size_t i,_Bool last,char **userpwd)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CURLcode CVar5;
  dynbuf dyn;
  char prompt [256];
  char passwd [2048];
  dynbuf local_958;
  char local_938 [256];
  char local_838 [2056];
  
  pcVar4 = *userpwd;
  CVar5 = CURLE_OK;
  if (pcVar4 != (char *)0x0) {
    pcVar2 = strchr(pcVar4,0x3a);
    pcVar3 = strchr(pcVar4,0x3b);
    CVar5 = CURLE_OK;
    if ((pcVar2 == (char *)0x0) && (*pcVar4 != ';')) {
      memset(local_838,0,0x800);
      curlx_dyn_init(&local_958,0x19000);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      if (last && i == 0) {
        curl_msnprintf(local_938,0x100,"Enter %s password for user \'%s\':",kind,*userpwd);
      }
      else {
        curl_msnprintf(local_938,0x100,"Enter %s password for user \'%s\' on URL #%zu:",kind,
                       *userpwd,i + 1);
      }
      getpass_r(local_938,local_838,0x800);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = ';';
      }
      CVar5 = CURLE_OK;
      CVar1 = curlx_dyn_addf(&local_958,"%s:%s",*userpwd,local_838);
      if (CVar1 == CURLE_OK) {
        free(*userpwd);
        pcVar4 = curlx_dyn_ptr(&local_958);
        *userpwd = pcVar4;
      }
      else {
        CVar5 = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return CVar5;
}

Assistant:

static CURLcode checkpasswd(const char *kind, /* for what purpose */
                            const size_t i,   /* operation index */
                            const bool last,  /* TRUE if last operation */
                            char **userpwd)   /* pointer to allocated string */
{
  char *psep;
  char *osep;

  if(!*userpwd)
    return CURLE_OK;

  /* Attempt to find the password separator */
  psep = strchr(*userpwd, ':');

  /* Attempt to find the options separator */
  osep = strchr(*userpwd, ';');

  if(!psep && **userpwd != ';') {
    /* no password present, prompt for one */
    char passwd[2048] = "";
    char prompt[256];
    struct curlx_dynbuf dyn;

    curlx_dyn_init(&dyn, MAX_USERPWDLENGTH);
    if(osep)
      *osep = '\0';

    /* build a nice-looking prompt */
    if(!i && last)
      curlx_msnprintf(prompt, sizeof(prompt),
                      "Enter %s password for user '%s':",
                      kind, *userpwd);
    else
      curlx_msnprintf(prompt, sizeof(prompt),
                      "Enter %s password for user '%s' on URL #%zu:",
                      kind, *userpwd, i + 1);

    /* get password */
    getpass_r(prompt, passwd, sizeof(passwd));
    if(osep)
      *osep = ';';

    if(curlx_dyn_addf(&dyn, "%s:%s", *userpwd, passwd))
      return CURLE_OUT_OF_MEMORY;

    /* return the new string */
    free(*userpwd);
    *userpwd = curlx_dyn_ptr(&dyn);
  }

  return CURLE_OK;
}